

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

NDeviceChannel * __thiscall MlmWrap::findTrodesChannel(MlmWrap *this,NDevice *device,string *ch)

{
  bool bVar1;
  iterator __pred;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  this_00;
  string *in_RCX;
  NDeviceChannel *in_RDI;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  channelit;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> channelsvec;
  NDevice *in_stack_ffffffffffffff48;
  NDeviceChannel *pNVar2;
  NDeviceChannel *this_01;
  string local_70 [32];
  NDeviceChannel *local_50;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  in_stack_ffffffffffffffc8;
  
  this_01 = (NDeviceChannel *)&stack0xffffffffffffffc8;
  pNVar2 = in_RDI;
  NDevice::getChannels(in_stack_ffffffffffffff48);
  __pred = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::begin
                     ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                      in_stack_ffffffffffffff48);
  local_50 = (NDeviceChannel *)
             std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::end
                       ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                        in_stack_ffffffffffffff48);
  std::__cxx11::string::string(local_70,in_RCX);
  this_00 = std::
            find_if<__gnu_cxx::__normal_iterator<NDeviceChannel*,std::vector<NDeviceChannel,std::allocator<NDeviceChannel>>>,MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,__pred._M_current);
  findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0::~__0
            ((anon_class_32_1_3fcf6523_for__M_pred *)0x1f864f);
  std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::end
            ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)this_00._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                      *)in_RDI,
                     (__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                      *)this_00._M_current);
  if (bVar1) {
    NDeviceChannel::NDeviceChannel(this_01);
  }
  else {
    __gnu_cxx::
    __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
    ::operator*((__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                 *)&stack0xffffffffffffffc0);
    NDeviceChannel::NDeviceChannel(this_01,pNVar2);
  }
  std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector
            ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)this_01);
  return pNVar2;
}

Assistant:

NDeviceChannel MlmWrap::findTrodesChannel(const NDevice& device, std::string ch){
    //Finding channel
//    NDevice* device = *deviceit;
    auto channelsvec = device.getChannels();
    auto channelit = std::find_if(channelsvec.begin(), channelsvec.end(),
                                  [ch](NDeviceChannel cha){return cha.getId() == ch;});
    if(channelit == channelsvec.end()){
        return NDeviceChannel();
    }
    return *channelit;
}